

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseUser.cpp
# Opt level: O0

void __thiscall
BaseUser::BaseUser(BaseUser *this,char *passedFirstName,char *passedLastName,char *passedEmail,
                  char *passedPassword,bool passedAdmin)

{
  char *pcVar1;
  int iVar2;
  BaseUser *this_00;
  char *local_b8;
  char *local_a8;
  char *local_98;
  undefined1 *local_80;
  allocator local_61;
  string local_60;
  BaseUser *local_40;
  BaseUser *user;
  char *pcStack_30;
  bool passedAdmin_local;
  char *passedPassword_local;
  char *passedEmail_local;
  char *passedLastName_local;
  char *passedFirstName_local;
  BaseUser *this_local;
  
  user._7_1_ = passedAdmin;
  pcStack_30 = passedPassword;
  passedPassword_local = passedEmail;
  passedEmail_local = passedLastName;
  passedLastName_local = passedFirstName;
  passedFirstName_local = (char *)this;
  Model<BaseUser>::Model(&this->super_Model<BaseUser>);
  (this->super_Model<BaseUser>)._vptr_Model = (_func_int **)&PTR_save_00174010;
  local_80 = &(this->super_Model<BaseUser>).field_0xc;
  do {
    *local_80 = 0;
    local_80 = local_80 + 1;
  } while (local_80 != this->lastName);
  local_98 = this->lastName;
  do {
    *local_98 = '\0';
    local_98 = local_98 + 1;
  } while (local_98 != this->email);
  local_a8 = this->email;
  do {
    *local_a8 = '\0';
    local_a8 = local_a8 + 1;
  } while (local_a8 != this->password);
  local_b8 = this->password;
  do {
    *local_b8 = '\0';
    local_b8 = local_b8 + 1;
  } while ((bool *)local_b8 != &this->admin);
  this->admin = (bool)(user._7_1_ & 1);
  strcpy(&(this->super_Model<BaseUser>).field_0xc,passedLastName_local);
  strcpy(this->lastName,passedEmail_local);
  strcpy(this->password,pcStack_30);
  strcpy(this->email,passedPassword_local);
  pcVar1 = passedPassword_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,pcVar1,&local_61);
  this_00 = findByEmail(&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  if (this_00 != (BaseUser *)0x0) {
    local_40 = this_00;
    iVar2 = Model<BaseUser>::getId(&this_00->super_Model<BaseUser>);
    (this->super_Model<BaseUser>).id = iVar2;
  }
  return;
}

Assistant:

BaseUser::BaseUser(const char *passedFirstName, const char *passedLastName, const char *passedEmail,
                   const char *passedPassword, bool passedAdmin) : admin(passedAdmin) {
    strcpy(firstName, passedFirstName);
    strcpy(lastName, passedLastName);
    strcpy(password, passedPassword);
    strcpy(email, passedEmail);
    BaseUser *user = BaseUser::findByEmail(passedEmail);
    if(user) id = user->getId();
}